

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

int slang::syntax::SyntaxFacts::getPrecedence(SyntaxKind kind)

{
  ulong uVar1;
  
  if (0x117 < (int)kind) {
    if ((int)kind < 0x1b7) {
      if ((int)kind < 0x18a) {
        uVar1 = (ulong)(kind - ModAssignmentExpression);
        if (kind - ModAssignmentExpression < 0x2a) {
          if ((0x8100002001U >> (uVar1 & 0x3f) & 1) != 0) {
            return 1;
          }
          if ((0x4002UL >> (uVar1 & 0x3f) & 1) != 0) {
            return 0xc;
          }
          if ((0x30000000000U >> (uVar1 & 0x3f) & 1) != 0) {
            return 4;
          }
        }
        if (kind != PowerExpression) {
          return 0;
        }
        return 0xd;
      }
      if (kind - SUntilPropertyExpr < 2) {
        return 2;
      }
      if (kind == SubtractAssignmentExpression) {
        return 1;
      }
      if (kind != SubtractExpression) {
        return 0;
      }
      return 0xb;
    }
    uVar1 = (ulong)(kind - ThroughoutSequenceExpr);
    if (kind - ThroughoutSequenceExpr < 0x3e) {
      if ((0x1ffe000000U >> (uVar1 & 0x3f) & 1) != 0) {
        return 0xe;
      }
      if ((0x3000000000000001U >> (uVar1 & 0x3f) & 1) != 0) {
        return 8;
      }
      if ((0xc00000000000U >> (uVar1 & 0x3f) & 1) != 0) {
        return 2;
      }
    }
    if (kind == WithinSequenceExpr) {
      return 7;
    }
    if (kind == XorAssignmentExpression) {
      return 1;
    }
    return 0;
  }
  if ((int)kind < 0xad) {
    if ((int)kind < 0x28) {
      switch(kind) {
      case AddAssignmentExpression:
      case AndAssignmentExpression:
      case ArithmeticLeftShiftAssignmentExpression:
      case ArithmeticRightShiftAssignmentExpression:
        goto switchD_001a4dc8_caseD_106;
      case AddExpression:
        return 0xb;
      case AlwaysBlock:
      case AlwaysCombBlock:
      case AlwaysFFBlock:
      case AlwaysLatchBlock:
      case AnsiPortList:
      case AnsiUdpPortList:
      case ArgumentList:
        break;
      case AndPropertyExpr:
      case AndSequenceExpr:
        return 5;
      case ArithmeticShiftLeftExpression:
      case ArithmeticShiftRightExpression:
        goto switchD_001a4dc8_caseD_109;
      default:
        if (kind == AssignmentExpression) {
          return 1;
        }
      }
    }
    else if ((int)kind < 0x39) {
      if (kind - BinaryXnorExpression < 2) {
        return 6;
      }
      if (kind == BinaryAndExpression) {
        return 7;
      }
      if (kind == BinaryOrExpression) {
        return 5;
      }
    }
    else if ((int)kind < 0x90) {
      if (kind == CaseEqualityExpression) {
        return 8;
      }
      if (kind == CaseInequalityExpression) {
        return 8;
      }
    }
    else {
      if (kind == DivideAssignmentExpression) {
        return 1;
      }
      if (kind == DivideExpression) {
        return 0xc;
      }
    }
  }
  else {
    switch(kind) {
    case ImpliesPropertyExpr:
    case LogicalEquivalenceExpression:
    case LogicalImplicationExpression:
      return 2;
    case IncludeDirective:
    case InitialBlock:
    case InstanceConfigRule:
    case InstanceName:
    case IntType:
    case IntegerLiteralExpression:
    case IntegerType:
    case IntegerVectorExpression:
    case InterfaceDeclaration:
    case InterfaceHeader:
    case InterfacePortHeader:
    case IntersectClause:
    case InvocationExpression:
    case JumpStatement:
    case LetDeclaration:
    case LineDirective:
    case LocalScope:
    case LocalVariableDeclaration:
    case LogicType:
      break;
    case InequalityExpression:
      return 8;
    case InsideExpression:
    case LessThanEqualExpression:
    case LessThanExpression:
      return 9;
    case IntersectSequenceExpr:
      return 6;
    case LogicalAndExpression:
      return 4;
    case LogicalLeftShiftAssignmentExpression:
    case LogicalRightShiftAssignmentExpression:
switchD_001a4dc8_caseD_106:
      return 1;
    case LogicalOrExpression:
      return 3;
    case LogicalShiftLeftExpression:
    case LogicalShiftRightExpression:
switchD_001a4dc8_caseD_109:
      return 10;
    default:
      uVar1 = (ulong)(kind - ExpressionOrDist);
      if (kind - ExpressionOrDist < 0x2d) {
        if ((0x6000001UL >> (uVar1 & 0x3f) & 1) != 0) {
          return 9;
        }
        if ((0x100000000400U >> (uVar1 & 0x3f) & 1) != 0) {
          return 1;
        }
        if (uVar1 == 0x25) {
          return 3;
        }
      }
      if (kind == EqualityExpression) {
        return 8;
      }
    }
  }
  return 0;
}

Assistant:

int SyntaxFacts::getPrecedence(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            return 1;
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
            return 2;
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::IffPropertyExpr:
            return 3;
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::OrSequenceExpr:
            return 4;
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::AndSequenceExpr:
            return 5;
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::IntersectSequenceExpr:
            return 6;
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::WithinSequenceExpr:
            return 7;
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::ThroughoutSequenceExpr:
            return 8;
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::InsideExpression:
        case SyntaxKind::ExpressionOrDist:
            return 9;
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
            return 10;
        case SyntaxKind::AddExpression:
        case SyntaxKind::SubtractExpression:
            return 11;
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ModExpression:
            return 12;
        case SyntaxKind::PowerExpression:
            return 13;
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            return 14;
        default:
            return 0;
    }
}